

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

mat4 * mat4_orthographic_projection
                 (mat4 *__return_storage_ptr__,float left,float right,float bottom,float top,
                 float near,float far)

{
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint in_XMM4_Db;
  undefined4 in_XMM5_Db;
  undefined1 auVar1 [16];
  
  __return_storage_ptr__->m[0] = 2.0 / (right - left);
  __return_storage_ptr__->m[1] = 0.0;
  __return_storage_ptr__->m[2] = 0.0;
  __return_storage_ptr__->m[3] = -(left + right) / (right - left);
  __return_storage_ptr__->m[4] = 0.0;
  __return_storage_ptr__->m[5] = 2.0 / (top - bottom);
  __return_storage_ptr__->m[6] = 0.0;
  __return_storage_ptr__->m[7] = -(bottom + top) / (top - bottom);
  auVar2._0_8_ = (undefined8)DAT_001e58c0;
  auVar2._8_4_ = DAT_001e58c0._4_4_;
  auVar2._12_4_ = in_XMM4_Db ^ 0x80000000;
  auVar1._8_8_ = auVar2._8_8_;
  auVar1._0_8_ = CONCAT44(near + far,(int)DAT_001e58c0) ^ 0x8000000000000000;
  auVar3._4_4_ = far - near;
  auVar3._0_4_ = far - near;
  auVar3._8_4_ = in_XMM5_Db;
  auVar3._12_4_ = in_XMM5_Db;
  auVar3 = divps(auVar1,auVar3);
  __return_storage_ptr__->m[8] = 0.0;
  __return_storage_ptr__->m[9] = 0.0;
  *(long *)(__return_storage_ptr__->m + 10) = auVar3._0_8_;
  __return_storage_ptr__->m[0xc] = 0.0;
  __return_storage_ptr__->m[0xd] = 0.0;
  __return_storage_ptr__->m[0xe] = 0.0;
  __return_storage_ptr__->m[0xf] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4_orthographic_projection(float left, float right, float bottom, float top,
        float near, float far) {
    float a = 2.0f / (right - left);
    float b = 2.0f / (top - bottom);
    float c = -2.0f / (far - near);
    float d = -(right + left) / (right - left);
    float e = -(top + bottom) / (top - bottom);
    float f = -(far + near) / (far - near);

    return mat4_create(
            a, 0.0f, 0.0f, d,
            0.0f, b, 0.0f, e,
            0.0f, 0.0f, c, f,
            0.0f, 0.0f, 0.0f, 1.0f);
}